

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

void uv__run_pending(uv_loop_t *loop)

{
  long *plVar1;
  long *plVar2;
  void **ppvVar3;
  long *local_28;
  void *local_20 [2];
  
  local_28 = (long *)&local_28;
  plVar1 = (long *)loop->pending_queue[0];
  if (loop->pending_queue == (void **)plVar1) {
    ppvVar3 = local_20;
  }
  else {
    local_20[0] = loop->pending_queue[1];
    *(long ***)local_20[0] = &local_28;
    plVar2 = (long *)plVar1[1];
    ppvVar3 = (void **)(plVar1 + 1);
    loop->pending_queue[1] = plVar2;
    *plVar2 = (long)loop->pending_queue;
    local_28 = plVar1;
  }
  *ppvVar3 = &local_28;
  while (&local_28 != (long **)local_28) {
    *(long *)local_28[1] = *local_28;
    *(long *)(*local_28 + 8) = local_28[1];
    *local_28 = (long)local_28;
    local_28[1] = (long)local_28;
    (*(code *)local_28[-1])(loop,local_28 + -1,4);
  }
  return;
}

Assistant:

static void uv__run_pending(uv_loop_t* loop) {
  QUEUE* q;
  QUEUE pq;
  uv__io_t* w;

  QUEUE_MOVE(&loop->pending_queue, &pq);

  while (!QUEUE_EMPTY(&pq)) {
    q = QUEUE_HEAD(&pq);
    QUEUE_REMOVE(q);
    QUEUE_INIT(q);
    w = QUEUE_DATA(q, uv__io_t, pending_queue);
    w->cb(loop, w, POLLOUT);
  }
}